

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O2

void __thiscall
ggml_backend_registry::register_backend
          (ggml_backend_registry *this,ggml_backend_reg_t reg,dl_handle_ptr *handle)

{
  ulong uVar1;
  ggml_backend_dev_t device;
  size_t i;
  ulong uVar2;
  ggml_backend_reg_entry local_28;
  
  if (reg != (ggml_backend_reg_t)0x0) {
    local_28.handle =
         (dl_handle_ptr)
         (handle->_M_t).super___uniq_ptr_impl<void,_dl_handle_deleter>._M_t.
         super__Tuple_impl<0UL,_void_*,_dl_handle_deleter>.super__Head_base<0UL,_void_*,_false>.
         _M_head_impl;
    (handle->_M_t).super___uniq_ptr_impl<void,_dl_handle_deleter>._M_t.
    super__Tuple_impl<0UL,_void_*,_dl_handle_deleter>.super__Head_base<0UL,_void_*,_false>.
    _M_head_impl = (void *)0x0;
    local_28.reg = reg;
    std::vector<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>::
    emplace_back<ggml_backend_reg_entry>(&this->backends,&local_28);
    std::unique_ptr<void,_dl_handle_deleter>::~unique_ptr(&local_28.handle);
    uVar2 = 0;
    while( true ) {
      uVar1 = ggml_backend_reg_dev_count(reg);
      if (uVar1 <= uVar2) break;
      device = (ggml_backend_dev_t)ggml_backend_reg_dev_get(reg,uVar2);
      register_device(this,device);
      uVar2 = uVar2 + 1;
    }
  }
  return;
}

Assistant:

void register_backend(ggml_backend_reg_t reg, dl_handle_ptr handle = nullptr) {
        if (!reg) {
            return;
        }

#ifndef NDEBUG
        GGML_LOG_DEBUG("%s: registered backend %s (%zu devices)\n",
            __func__, ggml_backend_reg_name(reg), ggml_backend_reg_dev_count(reg));
#endif
        backends.push_back({ reg, std::move(handle) });
        for (size_t i = 0; i < ggml_backend_reg_dev_count(reg); i++) {
            register_device(ggml_backend_reg_dev_get(reg, i));
        }
    }